

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ArenaStringPtr::DestroyNoArenaSlowPath(ArenaStringPtr *this)

{
  string *this_00;
  
  this_00 = UnsafeMutablePointer_abi_cxx11_(this);
  std::__cxx11::string::~string((string *)this_00);
  operator_delete(this_00);
  return;
}

Assistant:

void ArenaStringPtr::DestroyNoArenaSlowPath() { delete UnsafeMutablePointer(); }